

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

void __thiscall
LLVMBC::LLVMContext::TypedDeleter<LLVMBC::BranchInst>::run(TypedDeleter<LLVMBC::BranchInst> *this)

{
  TypedDeleter<LLVMBC::BranchInst> *this_local;
  
  BranchInst::~BranchInst(this->ptr);
  return;
}

Assistant:

void run() override
		{
			ptr->~T();
		}